

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeoLocusIntersect.cpp
# Opt level: O0

int GeoCalcs::GeoLocusIntersect
              (LLPoint *gStart,LLPoint *gEnd,Locus *loc,LLPoint *intersect,double dTol,double dEps)

{
  bool bVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  LLPoint LVar5;
  double distLocStPt1;
  double local_118;
  double local_110;
  int local_104;
  int maxCount;
  int k;
  double distBase;
  double errarray [2];
  double distarray [2];
  double distLoc;
  LLPoint ptInt;
  double distFromPt;
  double crsFromPt;
  double tcrs;
  LLPoint pt1;
  double dist23;
  double dist13;
  double crs32;
  double crs31;
  double locLength;
  double locStAz;
  double gAz;
  InverseResult result;
  double dEps_local;
  double dTol_local;
  LLPoint *intersect_local;
  Locus *loc_local;
  LLPoint *gEnd_local;
  LLPoint *gStart_local;
  
  result.distance = dEps;
  INVERSE_RESULT::INVERSE_RESULT((INVERSE_RESULT *)&gAz);
  DistVincenty(gStart,gEnd,(InverseResult *)&gAz);
  locStAz = gAz;
  DistVincenty(&loc->locusStart,&loc->locusEnd,(InverseResult *)&gAz);
  locLength = gAz;
  crs31 = result.reverseAzimuth;
  LLPOINT::LLPOINT((LLPOINT *)&tcrs);
  bVar1 = CrsIntersect(&loc->locusStart,locLength,&crs32,&dist23,gStart,locStAz,&dist13,
                       &pt1.longitude,dTol,(LLPoint *)&tcrs);
  if (bVar1) {
    DistVincenty(&loc->geoStart,&loc->geoEnd,(InverseResult *)&gAz);
    crsFromPt = gAz;
    _distLoc = PerpIntercept(&loc->geoStart,gAz,(LLPoint *)&tcrs,&distFromPt,&ptInt.longitude,dTol);
    dVar3 = DistToLocusP(loc,(LLPoint *)&distLoc,dTol,result.distance);
    dVar3 = ptInt.longitude - ABS(dVar3);
    distarray[0] = pt1.longitude;
    errarray[0] = dVar3;
    dVar4 = SignAzimuthDifference(distFromPt,dist13);
    dVar4 = cos(ABS(dVar4));
    _maxCount = pt1.longitude - dVar3 / dVar4;
    local_104 = 0;
    while( true ) {
      uVar2 = std::isnan(_maxCount);
      bVar1 = false;
      if (((uVar2 & 1) == 0) && (bVar1 = false, dTol < ABS(errarray[0]))) {
        bVar1 = local_104 < 10;
      }
      if (!bVar1) break;
      LVar5 = DestVincenty(gStart,locStAz,_maxCount);
      local_118 = LVar5.latitude;
      tcrs = local_118;
      local_110 = LVar5.longitude;
      pt1.latitude = local_110;
      distBase = errarray[0];
      errarray[1] = distarray[0];
      distarray[0] = _maxCount;
      _distLoc = PerpIntercept(&loc->geoStart,crsFromPt,(LLPoint *)&tcrs,&distFromPt,
                               &ptInt.longitude,dTol);
      dVar3 = DistToLocusP(loc,(LLPoint *)&distLoc,dTol,result.distance);
      errarray[0] = ptInt.longitude - ABS(dVar3);
      FindLinearRoot(errarray + 1,&distBase,(double *)&maxCount);
      local_104 = local_104 + 1;
    }
    intersect->latitude = tcrs;
    intersect->longitude = pt1.latitude;
    DistVincenty(intersect,&loc->locusStart,(InverseResult *)&gAz);
    dVar3 = result.reverseAzimuth;
    DistVincenty(intersect,&loc->locusEnd,(InverseResult *)&gAz);
    bVar1 = IsNearZero(crs31 - (dVar3 + result.reverseAzimuth),0.005);
    if (bVar1) {
      gStart_local._4_4_ = 1;
    }
    else {
      gStart_local._4_4_ = 0;
    }
  }
  else {
    gStart_local._4_4_ = 0;
  }
  return gStart_local._4_4_;
}

Assistant:

int GeoLocusIntersect(const LLPoint &gStart, const LLPoint &gEnd, const Locus &loc, LLPoint &intersect,
                          double dTol, double dEps)
    {
        InverseResult result;
        DistVincenty(gStart, gEnd, result);
        const double gAz = result.azimuth;

        DistVincenty(loc.locusStart, loc.locusEnd, result);
        const double locStAz = result.azimuth;
        const double locLength = result.distance;

        double crs31, crs32, dist13, dist23;
        LLPoint pt1;
        if (!CrsIntersect(loc.locusStart, locStAz, crs31, dist13, gStart, gAz, crs32, dist23, dTol, pt1))
            return 0;

        DistVincenty(loc.geoStart, loc.geoEnd, result);

        const double tcrs = result.azimuth;
        double crsFromPt, distFromPt;
        LLPoint ptInt = PerpIntercept(loc.geoStart, tcrs, pt1, crsFromPt, distFromPt, dTol);

        double distLoc = DistToLocusP(loc, ptInt, dTol, dEps);

        double distarray[2];
        double errarray[2];
        errarray[1] = distFromPt - fabs(distLoc);
        distarray[1] = dist23;

        double distBase = dist23 - errarray[1] / cos(fabs(SignAzimuthDifference(crsFromPt, crs32)));

        int k = 0;
        const int maxCount = 10;
        while (!std::isnan(distBase) && fabs(errarray[1]) > dTol && k < maxCount)
        {
            pt1 = DestVincenty(gStart, gAz, distBase);
            errarray[0] = errarray[1];
            distarray[0] = distarray[1];
            distarray[1] = distBase;

            ptInt = PerpIntercept(loc.geoStart, tcrs, pt1, crsFromPt, distFromPt, dTol);
            distLoc = DistToLocusP(loc, ptInt, dTol, dEps);
            errarray[1] = distFromPt - fabs(distLoc);

            FindLinearRoot(distarray, errarray, distBase);
            k++;
        }
        intersect = pt1;

        DistVincenty(intersect, loc.locusStart, result);
        const double distLocStPt1 = result.distance;
        DistVincenty(intersect, loc.locusEnd, result);

        // found intersect point must be on or between locus
        // If 5e-3 is to tight a tolerance then try setting to 5e-2
        // For the 8260.54A Appendix test cases 1e-3 was to tight, 5e-3
        // works just fine.
        if (!IsNearZero(locLength - (distLocStPt1 + result.distance), 5e-3))
            return 0;
        return 1;
    }